

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void release_handler_ref(mg_connection *conn,mg_handler_info *handler_info)

{
  if (handler_info != (mg_handler_info *)0x0) {
    mg_lock_context(conn->phys_ctx);
    handler_info->refcount = handler_info->refcount - 1;
    mg_unlock_context(conn->phys_ctx);
    return;
  }
  return;
}

Assistant:

static void
release_handler_ref(struct mg_connection *conn,
                    struct mg_handler_info *handler_info)
{
	if (handler_info != NULL) {
		/* Use context lock for ref counter */
		mg_lock_context(conn->phys_ctx);
		handler_info->refcount--;
		mg_unlock_context(conn->phys_ctx);
	}
}